

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<false,_false,_false>::pack_tail(DaTrie<false,_false,_false> *this)

{
  bool bVar1;
  uint32_t uVar2;
  reference pvVar3;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  Query query;
  char *_tail;
  uint32_t node_pos;
  vector<char,_std::allocator<char>_> tail;
  _Tp_alloc_type *in_stack_ffffffffffffff80;
  DaTrie<false,_false,_false> *in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffffb0;
  Query *in_stack_ffffffffffffffb8;
  DaTrie<false,_false,_false> *in_stack_ffffffffffffffc0;
  uint local_30;
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x16001b);
  std::vector<char,_std::allocator<char>_>::size
            ((vector<char,_std::allocator<char>_> *)(in_RDI + 1));
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffffb0,(size_type)in_RDI);
  std::vector<char,_std::allocator<char>_>::swap
            (in_stack_ffffffffffffff90,
             (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff88);
  for (local_30 = 0; uVar2 = bc_size((DaTrie<false,_false,_false> *)0x160070), local_30 < uVar2;
      local_30 = local_30 + 1) {
    pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_30);
    bVar1 = Bc::is_leaf(pvVar3);
    if ((bVar1) &&
       (bVar1 = is_terminal_(in_stack_ffffffffffffff88,
                             (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20)), !bVar1)) {
      in_stack_ffffffffffffff90 =
           (vector<char,_std::allocator<char>_> *)
           std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1600bf);
      pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_30);
      uVar2 = Bc::value(pvVar3);
      in_stack_ffffffffffffff80 =
           &(in_stack_ffffffffffffff90->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Tp_alloc_type + uVar2;
      Query::Query((Query *)&stack0xffffffffffffffb0,(char *)in_stack_ffffffffffffff80);
      uVar2 = utils::length((char *)0x16010d);
      uVar2 = utils::extract_value((char *)(in_stack_ffffffffffffff80 + uVar2));
      in_stack_ffffffffffffff88 = (DaTrie<false,_false,_false> *)&stack0xffffffffffffffb0;
      Query::set_value((Query *)in_stack_ffffffffffffff88,uVar2);
      Query::set_node_pos((Query *)in_stack_ffffffffffffff88,local_30);
      insert_tail_(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      Query::~Query((Query *)&stack0xffffffffffffffb0);
    }
  }
  *(undefined4 *)
   &in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0;
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void pack_tail() {
    assert(!Prefix);

    std::vector<char> tail;
    tail.reserve(tail_.size() - tail_emps_);

    tail_.swap(tail);

    for (uint32_t node_pos = 0; node_pos < bc_size(); ++node_pos) {
      if (bc_[node_pos].is_leaf() && !is_terminal_(node_pos)) {
        auto _tail = tail.data() + bc_[node_pos].value();
        Query query(_tail);
        query.set_value(utils::extract_value(_tail + utils::length(_tail)));
        query.set_node_pos(node_pos);
        insert_tail_(query);
      }
    }
    tail_emps_ = 0;
  }